

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O3

void cdns_readcb(int fd,short what,void *_arg)

{
  uint *puVar1;
  server_info *svr;
  uint16_t uVar2;
  int iVar3;
  ulong len;
  long lVar4;
  short *psVar5;
  void *pvVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  undefined8 uVar10;
  long local_10a8;
  long local_10a0;
  long local_1098;
  long local_1090;
  char ip_str [55];
  timeval local_1048;
  char buf [4096];
  
  svr = *_arg;
  if ((what & 1U) != 0) {
    if (*(short *)((long)_arg + 8) != 3) {
      update_server_rtt(svr,(uint)*(ushort *)((long)_arg + 0xe) * 1000);
    }
    goto LAB_00107198;
  }
  len = recvfrom(fd,buf,0x1000,0,(sockaddr *)0x0,(socklen_t *)0x0);
  if (len == 0xffffffffffffffff) goto LAB_00107198;
  fmt_sockaddr_port((sockaddr *)(*_arg + 0x10),ip_str,0x37);
  gettimeofday(&local_1048,(__timezone_ptr_t)0x0);
  local_1098 = local_1048.tv_sec;
  lVar9 = local_1048.tv_sec - *(long *)((long)_arg + 0xa8);
  local_1090 = local_1048.tv_usec;
  lVar4 = local_1048.tv_usec - *(long *)((long)_arg + 0xb0);
  if (lVar4 < 0) {
    lVar9 = lVar9 + -1;
    lVar4 = lVar4 + 1000000;
    local_10a8 = lVar9;
    local_10a0 = lVar4;
  }
  lVar4 = lVar4 / 1000 + lVar9 * 1000;
  if (((ulong)svr->hijack_threshold == 0) || ((long)(ulong)svr->hijack_threshold < lVar4)) {
    if ((len < 0xd) || (*(short *)((long)_arg + 0xc) != buf._0_2_)) {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x11a
                 ,"verify_response",0,6,"Bad response");
LAB_00106fd4:
      uVar10 = 0xffffffff;
    }
    else {
      uVar10 = 0;
      if ((*(byte *)(*_arg + 0x90) & 1) == 0) {
LAB_00106e70:
        if ((((1 < (ushort)(buf._6_2_ << 8 | (ushort)buf._6_2_ >> 8)) || (buf._8_2_ != 0)) ||
            (buf._10_2_ != 0)) || ((buf[3] & 0xfU) != 0)) {
          uVar10 = 1;
        }
        psVar5 = (short *)dns_get_answered_ip(buf,len);
        if (((psVar5 != (short *)0x0) && (*psVar5 == 0x400)) &&
           (pvVar6 = blacklist_find_v4((ipv4_key *)(psVar5 + 1)), pvVar6 != (void *)0x0)) {
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                     0xf4,"is_ip_in_blacklist",0,7,"Found in blacklist: %x %hhu.%hhu.%hhu.%hhu",4,
                     (ulong)(uint)(int)(char)psVar5[1],(ulong)(uint)(int)*(char *)((long)psVar5 + 3)
                     ,(ulong)(uint)(int)(char)psVar5[2],
                     (ulong)(uint)(int)*(char *)((long)psVar5 + 5));
          pcVar7 = dns_get_answered_cnname(buf,len);
          if (pcVar7 == (char *)0x0) goto LAB_00106fd4;
        }
        if (((*(byte *)(*_arg + 0x90) & 2) != 0) && (buf._8_2_ == 0)) {
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                     0x144,"verify_response",0,7,"Lack of authority records");
          goto LAB_00106dd0;
        }
      }
      else {
        uVar2 = dns_get_edns_udp_payload_size(buf,len);
        if (uVar2 != 0) {
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                     0x123,"verify_response",0,7,"Possible good response (+edns)");
          uVar10 = 1;
          goto LAB_00106e70;
        }
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x127,"verify_response",0,7,"Bad response");
        psVar5 = (short *)dns_get_answered_ip(buf,len);
        uVar10 = 0xffffffff;
        if ((psVar5 != (short *)0x0) && (*psVar5 == 0x400)) {
          blacklist_add_v4((ipv4_key *)(psVar5 + 1));
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                     0xe8,"add_to_blacklist",0,7,"Add to blacklist: %x %hhu.%hhu.%hhu.%hhu",4,
                     (ulong)(uint)(int)(char)psVar5[1],(ulong)(uint)(int)*(char *)((long)psVar5 + 3)
                     ,(ulong)(uint)(int)(char)psVar5[2],
                     (ulong)(uint)(int)*(char *)((long)psVar5 + 5));
        }
      }
    }
  }
  else {
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x175,
               "cdns_readcb",0,7,"Response received from %s too fast!",ip_str);
LAB_00106dd0:
    uVar10 = 0xffffffff;
  }
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x17c,
             "cdns_readcb",0,7,
             "svr: %s req_id: %x pktlen: %zu rtt_ms: %ld avg rtt: %u verify_rc: %d",ip_str,
             (ulong)*(ushort *)((long)_arg + 0xc),len,lVar4,(ulong)(uint)(svr->stats).avg_rtt,uVar10
            );
  if ((int)uVar10 < 0) {
    lVar9 = local_1090 - *(long *)((long)_arg + 0xa0);
    lVar4 = lVar9 + 1000000;
    if (-1 < lVar9) {
      lVar4 = lVar9;
    }
    local_10a8 = ((ulong)*(ushort *)((long)_arg + 0xe) + (*(long *)((long)_arg + 0x98) - local_1098)
                 ) - (lVar9 >> 0x3f);
    local_10a0 = -lVar4;
    if (0 < lVar4) {
      local_10a8 = local_10a8 + -1;
      local_10a0 = 1000000 - lVar4;
    }
    iVar3 = event_add(*(undefined8 *)((long)_arg + 0x90),&local_10a8);
    if (iVar3 == 0) {
      return;
    }
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x1a5,
               "cdns_readcb",1,3,"event_add");
  }
  else {
    if (((int)uVar10 == 0) && (*(short *)((long)_arg + 8) == 1)) {
      *(undefined2 *)((long)_arg + 8) = 2;
    }
    iVar3 = event_get_fd(listener);
    uVar8 = sendto(iVar3,buf,len,0,(sockaddr *)((long)_arg + 0x10),0x80);
    if (uVar8 == 0xffffffffffffffff) {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x18e
                 ,"cdns_readcb",1,7,"sendto: Can\'t forward packet");
    }
    else if (uVar8 == len) {
      update_server_rtt(svr,(int)lVar4);
      puVar1 = &(svr->stats).n_rsp;
      *puVar1 = *puVar1 + 1;
    }
    else {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x191
                 ,"cdns_readcb",0,7,"sendto: I was sending %zd bytes, but only %zd were sent.",len,
                 uVar8);
    }
    *(undefined2 *)((long)_arg + 8) = 3;
  }
LAB_00107198:
  cdns_drop_request((dns_request *)_arg);
  return;
}

Assistant:

static void cdns_readcb(int fd, short what, void *_arg)
{
    dns_request * req = _arg;
    struct server_info * svr = req->server;
    struct timeval tv, rtt;
    char   buf[DEFAULT_BUFFER_SIZE];
    char   ip_str[INET_ADDR_PORT_STRLEN];
    size_t pktlen;
    int    rc;

    if (what & EV_TIMEOUT) {
        if (req->state != STATE_RESPONSE_SENT) {
            update_server_rtt(svr, req->timeout * 1000);
        }
        goto finish;
    }

    pktlen = recvfrom(fd, &buf[0], sizeof(buf), 0, NULL, NULL);
    if (pktlen == -1)
        goto finish;

    fmt_sockaddr_port((struct sockaddr *)&req->server->addr, &ip_str[0], sizeof(ip_str));
    // Calculate round trip time
    gettimeofday(&tv, 0);
    timersub(&tv, &req->req_fwd_time, &rtt);
    time_t rtt_ms = rtt.tv_sec * 1000 + rtt.tv_usec/1000;
    
    if (svr->hijack_threshold > 0 && rtt_ms <= svr->hijack_threshold) {
        log_error(LOG_DEBUG, "Response received from %s too fast!", &ip_str[0]);
        rc = -1;
    }
    else {
        rc = verify_response(req, &buf[0], pktlen);
    }
    log_error(LOG_DEBUG, "svr: %s req_id: %x pktlen: %zu rtt_ms: %ld avg rtt: %u verify_rc: %d",
              &ip_str[0], req->id, pktlen, rtt_ms, svr->stats.avg_rtt, rc);
    if (rc < 0)
        goto continue_waiting;
    if (rc > 0)
        goto accept;

    // TODO: can not determined?
    if (req->state == STATE_REQUEST_SENT) {
        req->state = STATE_RECV_1ST_RSP;
    }

accept:
    {
        int sender = event_get_fd(listener);
        ssize_t outgoing = sendto(sender, buf, pktlen, 0,
                                  (const struct sockaddr *)&req->client_addr,
                                  sizeof(req->client_addr));
        if (outgoing == -1) {
            log_errno(LOG_DEBUG, "sendto: Can't forward packet");
        }
        else if (outgoing != pktlen) {
            log_error(LOG_DEBUG, "sendto: I was sending %zd bytes, but only %zd were sent.", pktlen, outgoing);
        }
        else {
            update_server_rtt(svr, rtt_ms);
            svr->stats.n_rsp += 1;
        }
        req->state = STATE_RESPONSE_SENT;
    }
finish:
    cdns_drop_request(req);
    return;

continue_waiting:
    timersub(&tv, &req->req_recv_time, &rtt);
    tv.tv_sec = req->timeout;
    tv.tv_usec = 0;
    timersub(&tv, &rtt, &rtt);
    // update with time left for timeout
    int error = event_add(req->resolver, &rtt);
    if (error) {
        log_errno(LOG_ERR, "event_add");
        cdns_drop_request(req);
    }
    return;

}